

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  size_t sVar1;
  bool bVar2;
  id tid;
  system_error *this_00;
  error_category *peVar3;
  error_code __ec;
  
  tid._M_thread = pthread_self();
  std::mutex::lock(&this->mtx_);
  if ((this->e_owner_)._M_thread != tid._M_thread) {
    bVar2 = is_shared_owner(this,tid);
    if (!bVar2) {
      sVar1 = (this->state_).rwcount;
      if (sVar1 == 0) {
        rwlock::ReaderPrefer::acquire_wlock(&this->state_);
        (this->e_owner_)._M_thread = tid._M_thread;
        validator::deadlock::locked((uintptr_t)this,tid,false);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return sVar1 == 0;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar3 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar3;
  __ec._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec,"recursive try_lock");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool try_lock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock");
#endif
    }
    if (RwLockPolicy::wait_wlock(state_))
      return false;
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }